

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::log_internal::ScopedMinLogLevel::~ScopedMinLogLevel(ScopedMinLogLevel *this)

{
  ScopedMinLogLevel *this_local;
  
  SetMinLogLevel(this->saved_severity_);
  return;
}

Assistant:

ScopedMinLogLevel::~ScopedMinLogLevel() {
  absl::SetMinLogLevel(saved_severity_);
}